

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsUtils.cpp
# Opt level: O0

void * Js::UnboxAsmJsArguments(ScriptFunction *func,Var *origArgs,char *argDst,CallInfo callInfo)

{
  Type p_Var1;
  code *pcVar2;
  PropertyRecord *pPVar3;
  ushort uVar4;
  bool bVar5;
  ArgSlot AVar6;
  PropertyId PVar7;
  int32 iVar8;
  ProxyEntryPointInfo *pPVar9;
  undefined4 *puVar10;
  FunctionBody *this;
  AsmJsFunctionInfo *this_00;
  ScriptContext *scriptContext_00;
  size_t sVar11;
  int64 iVar12;
  double dVar13;
  AsmJsVarType local_d1;
  int64 local_d0;
  int64 val_2;
  double doubleVal;
  float local_b8;
  float local_b4;
  int32 val_1;
  float floatVal;
  long lStack_a8;
  int32 intVal_1;
  uint64 highVal;
  uint64 lowVal;
  Var high;
  Var low;
  PropertyRecord *highPropRecord;
  PropertyRecord *lowPropRecord;
  RecyclableObject *object;
  int64 val;
  AsmJsVarType local_5f;
  ushort local_5e;
  int32 intVal;
  undefined1 auStack_58 [2];
  ArgSlot i;
  uint actualArgCount;
  ArgumentReader reader;
  bool allowTestInputs;
  ScriptContext *scriptContext;
  AsmJsFunctionInfo *info;
  void *address;
  char *argDst_local;
  Var *origArgs_local;
  ScriptFunction *func_local;
  CallInfo callInfo_local;
  
  func_local = (ScriptFunction *)callInfo;
  pPVar9 = ScriptFunction::GetEntryPointInfo(func);
  p_Var1 = pPVar9->jsMethod;
  if (p_Var1 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsUtils.cpp"
                                ,0xb8,"(address)","address");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  this = JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  this_00 = FunctionBody::GetAsmJsFunctionInfo(this);
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)func);
  reader.super_Arguments.Values._7_1_ = DAT_01e9e23c & 1;
  ArgumentReader::ArgumentReader((ArgumentReader *)auStack_58,(CallInfo *)&func_local,origArgs);
  intVal = (_auStack_58 & 0xffffff) - 1;
  address = argDst + 8;
  local_5e = 0;
  argDst_local = (char *)origArgs;
  do {
    uVar4 = local_5e;
    AVar6 = AsmJsFunctionInfo::GetArgCount(this_00);
    if (AVar6 <= uVar4) {
      AsmJsModuleInfo::EnsureHeapAttached(func);
      return p_Var1;
    }
    local_5f = AsmJsFunctionInfo::GetArgType(this_00,local_5e);
    bVar5 = AsmJsVarType::isInt(&local_5f);
    if (bVar5) {
      if ((uint)local_5e < (uint)intVal) {
        if (((reader.super_Arguments.Values._7_1_ & 1) == 0) ||
           (bVar5 = VarIs<Js::JavascriptString>(*(Var *)argDst_local), !bVar5)) {
          val._4_4_ = JavascriptMath::ToInt32(*(Var *)argDst_local,scriptContext_00);
        }
        else {
          iVar12 = ConvertStringToInt64(*(Var *)argDst_local,scriptContext_00);
          val._4_4_ = (int32)iVar12;
        }
      }
      else {
        val._4_4_ = 0;
      }
      *(undefined8 *)address = 0;
      *(int32 *)address = val._4_4_;
    }
    else {
      val._3_1_ = AsmJsFunctionInfo::GetArgType(this_00,local_5e);
      bVar5 = AsmJsVarType::isInt64((AsmJsVarType *)((long)&val + 3));
      if (bVar5) {
        if ((reader.super_Arguments.Values._7_1_ & 1) == 0) {
          JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5e49f,(PCWSTR)0x0);
        }
        if ((uint)local_5e < (uint)intVal) {
          bVar5 = VarIs<Js::JavascriptString>(*(Var *)argDst_local);
          if (bVar5) {
            object = (RecyclableObject *)ConvertStringToInt64(*(Var *)argDst_local,scriptContext_00)
            ;
          }
          else {
            bVar5 = DynamicObject::IsBaseDynamicObject(*(Var *)argDst_local);
            if (bVar5) {
              lowPropRecord = (PropertyRecord *)VarTo<Js::RecyclableObject>(*(Var *)argDst_local);
              highPropRecord = (PropertyRecord *)0x0;
              low = (Var)0x0;
              sVar11 = PAL_wcslen(L"low");
              ScriptContext::GetOrAddPropertyRecord
                        (scriptContext_00,L"low",(int)sVar11,&highPropRecord);
              sVar11 = PAL_wcslen(L"high");
              ScriptContext::GetOrAddPropertyRecord
                        (scriptContext_00,L"high",(int)sVar11,(PropertyRecord **)&low);
              pPVar3 = lowPropRecord;
              PVar7 = PropertyRecord::GetPropertyId(highPropRecord);
              high = JavascriptOperators::OP_GetProperty(pPVar3,PVar7,scriptContext_00);
              pPVar3 = lowPropRecord;
              PVar7 = PropertyRecord::GetPropertyId((PropertyRecord *)low);
              lowVal = (uint64)JavascriptOperators::OP_GetProperty(pPVar3,PVar7,scriptContext_00);
              iVar8 = JavascriptMath::ToInt32(high,scriptContext_00);
              highVal = (uint64)iVar8;
              iVar8 = JavascriptMath::ToInt32((Var)lowVal,scriptContext_00);
              lStack_a8 = (long)iVar8;
              object = (RecyclableObject *)(lStack_a8 << 0x20 | highVal & 0xffffffff);
            }
            else {
              floatVal = (float)JavascriptMath::ToInt32(*(Var *)argDst_local,scriptContext_00);
              object = (RecyclableObject *)(long)(int)floatVal;
            }
          }
        }
        else {
          object = (RecyclableObject *)0x0;
        }
        *(RecyclableObject **)address = object;
      }
      else {
        val_1._3_1_ = AsmJsFunctionInfo::GetArgType(this_00,local_5e);
        bVar5 = AsmJsVarType::isFloat((AsmJsVarType *)((long)&val_1 + 3));
        if (bVar5) {
          if ((uint)local_5e < (uint)intVal) {
            if (((reader.super_Arguments.Values._7_1_ & 1) == 0) ||
               (bVar5 = VarIs<Js::JavascriptString>(*(Var *)argDst_local), !bVar5)) {
              dVar13 = JavascriptConversion::ToNumber(*(Var *)argDst_local,scriptContext_00);
              local_b4 = (float)dVar13;
            }
            else {
              iVar12 = ConvertStringToInt64(*(Var *)argDst_local,scriptContext_00);
              local_b8 = (float)iVar12;
              local_b4 = local_b8;
            }
          }
          else {
            local_b4 = (float)NumberConstants::NaN;
          }
          *(undefined8 *)address = 0;
          *(float *)address = local_b4;
        }
        else {
          doubleVal._7_1_ = AsmJsFunctionInfo::GetArgType(this_00,local_5e);
          bVar5 = AsmJsVarType::isDouble((AsmJsVarType *)((long)&doubleVal + 7));
          if (!bVar5) {
            local_d1 = AsmJsFunctionInfo::GetArgType(this_00,local_5e);
            bVar5 = AsmJsVarType::isSIMD(&local_d1);
            if (bVar5) {
              JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5e49f,(PCWSTR)0x0);
            }
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsUtils.cpp"
                                        ,0x143,"((0))","UNREACHED");
            if (bVar5) {
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
              JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5e49f,(PCWSTR)0x0);
            }
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          if ((uint)local_5e < (uint)intVal) {
            if (((reader.super_Arguments.Values._7_1_ & 1) == 0) ||
               (bVar5 = VarIs<Js::JavascriptString>(*(Var *)argDst_local), !bVar5)) {
              val_2 = (int64)JavascriptConversion::ToNumber(*(Var *)argDst_local,scriptContext_00);
            }
            else {
              local_d0 = ConvertStringToInt64(*(Var *)argDst_local,scriptContext_00);
              val_2 = local_d0;
            }
          }
          else {
            val_2 = (int64)NumberConstants::NaN;
          }
          *(int64 *)address = val_2;
        }
      }
    }
    address = (void *)((long)address + 8);
    argDst_local = argDst_local + 8;
    local_5e = local_5e + 1;
  } while( true );
}

Assistant:

void * UnboxAsmJsArguments(ScriptFunction* func, Var * origArgs, char * argDst, CallInfo callInfo)
    {
        void * address = reinterpret_cast<void*>(func->GetEntryPointInfo()->jsMethod);
        Assert(address);
        AsmJsFunctionInfo* info = func->GetFunctionBody()->GetAsmJsFunctionInfo();
        ScriptContext* scriptContext = func->GetScriptContext();

#if ENABLE_DEBUG_CONFIG_OPTIONS
        bool allowTestInputs = CONFIG_FLAG(WasmI64);
#endif
        ArgumentReader reader(&callInfo, origArgs);
        uint actualArgCount = reader.Info.Count - 1; // -1 for ScriptFunction
        argDst = argDst + MachPtr; // add one first so as to skip the ScriptFunction argument
        for (ArgSlot i = 0; i < info->GetArgCount(); i++)
        {

            if (info->GetArgType(i).isInt())
            {
                int32 intVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        intVal = (int32)ConvertStringToInt64(*origArgs, scriptContext);
                    }
                    else
#endif
                        intVal = JavascriptMath::ToInt32(*origArgs, scriptContext);
                }
                else
                {
                    intVal = 0;
                }

#if TARGET_64
                *(int64*)(argDst) = 0;
#endif
                *(int32*)argDst = intVal;
                argDst = argDst + MachPtr;
            }
            else if (info->GetArgType(i).isInt64())
            {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                if (!allowTestInputs)
#endif
                {
                    JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
                }

#if ENABLE_DEBUG_CONFIG_OPTIONS
                int64 val;
                if (i < actualArgCount)
                {
                    if (VarIs<JavascriptString>(*origArgs))
                    {
                        val = ConvertStringToInt64(*origArgs, scriptContext);
                    }
                    else if (DynamicObject::IsBaseDynamicObject(*origArgs))
                    {
                        RecyclableObject* object = VarTo<RecyclableObject>(*origArgs);
                        PropertyRecord const * lowPropRecord = nullptr;
                        PropertyRecord const * highPropRecord = nullptr;
                        scriptContext->GetOrAddPropertyRecord(_u("low"), (int)wcslen(_u("low")), &lowPropRecord);
                        scriptContext->GetOrAddPropertyRecord(_u("high"), (int)wcslen(_u("high")), &highPropRecord);
                        Var low = JavascriptOperators::OP_GetProperty(object, lowPropRecord->GetPropertyId(), scriptContext);
                        Var high = JavascriptOperators::OP_GetProperty(object, highPropRecord->GetPropertyId(), scriptContext);

                        uint64 lowVal = JavascriptMath::ToInt32(low, scriptContext);
                        uint64 highVal = JavascriptMath::ToInt32(high, scriptContext);
                        val = (highVal << 32) | (lowVal & 0xFFFFFFFF);
                    }
                    else
                    {
                        int32 intVal = JavascriptMath::ToInt32(*origArgs, scriptContext);
                        val = (int64)intVal;
                    }
                }
                else
                {
                    val = 0;
                }

                *(int64*)(argDst) = val;
                argDst += sizeof(int64);
#endif
            }
            else if (info->GetArgType(i).isFloat())
            {
                float floatVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        int32 val = (int32)ConvertStringToInt64(*origArgs, scriptContext);
                        floatVal = *(float*)&val;
                    }
                    else
#endif
                        floatVal = (float)(JavascriptConversion::ToNumber(*origArgs, scriptContext));
                }
                else
                {
                    floatVal = (float)(JavascriptNumber::NaN);
                }
#if TARGET_64
                *(int64*)(argDst) = 0;
#endif
                *(float*)argDst = floatVal;
                argDst = argDst + MachPtr;
            }
            else if (info->GetArgType(i).isDouble())
            {
                double doubleVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        int64 val = ConvertStringToInt64(*origArgs, scriptContext);
                        doubleVal = *(double*)&val;
                    }
                    else
#endif
                        doubleVal = JavascriptConversion::ToNumber(*origArgs, scriptContext);
                }
                else
                {
                    doubleVal = JavascriptNumber::NaN;
                }

                *(double*)argDst = doubleVal;
                argDst = argDst + sizeof(double);
            }
            else if (info->GetArgType(i).isSIMD())
            {
                // Todo:: support test input for wasm.simd
                JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
            }
            else
            {
                Assert(UNREACHED);
                JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
            }
            ++origArgs;
        }

        AsmJsModuleInfo::EnsureHeapAttached(func);

        // for convenience, lets take the opportunity to return the asm.js entrypoint address
        return address;
    }